

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmList.cxx
# Opt level: O1

void __thiscall
anon_unknown.dwarf_620c17::TransformNoSelector::~TransformNoSelector(TransformNoSelector *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  
  (this->super_TransformSelector).super_TransformSelector._vptr_TransformSelector =
       (_func_int **)&PTR__TransformSelector_00aa0bc0;
  pcVar2 = (this->super_TransformSelector).Tag._M_dataplus._M_p;
  paVar1 = &(this->super_TransformSelector).Tag.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != paVar1) {
    operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
  }
  operator_delete(this,0x28);
  return;
}

Assistant:

TransformNoSelector()
    : TransformSelector("NO SELECTOR")
  {
  }